

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

TPZCompMesh * __thiscall
TPZHybridizeHDiv::CreateMultiphysicsMesh
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *cmesh_HDiv,
          double Lagrange_term_multiplier)

{
  TPZVec<TPZCompMesh_*> *pTVar1;
  long lVar2;
  int64_t iVar3;
  TPZCompMesh *mesh;
  TPZCompMesh *this_00;
  TPZMultiphysicsCompMesh *in_RSI;
  TPZVec<TPZCompMesh_*> *in_RDI;
  TPZManVector<int,_5> active;
  TPZMultiphysicsCompMesh *cmesh_Hybrid;
  TPZGeoMesh *gmesh;
  TPZVec<TPZCompMesh_*> *in_stack_000000b8;
  TPZHybridizeHDiv *in_stack_000000c0;
  int i;
  TPZManVector<TPZCompMesh_*,_3> meshvec_Hybrid;
  double in_stack_00000210;
  TPZCompMesh *in_stack_00000218;
  TPZHybridizeHDiv *in_stack_00000220;
  TPZCompMesh *in_stack_fffffffffffffef0;
  TPZCompMesh **in_stack_ffffffffffffff00;
  TPZCompMesh *in_stack_ffffffffffffff08;
  TPZMultiphysicsCompMesh *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  TPZCompMesh *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar4;
  TPZVec<int> *active_approx_spaces;
  TPZMultiphysicsCompMesh *in_stack_ffffffffffffffb0;
  
  pTVar1 = TPZMultiphysicsCompMesh::MeshVector(in_RSI);
  TPZVec<TPZCompMesh_*>::size(pTVar1);
  active_approx_spaces = (TPZVec<int> *)0x0;
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            ((TPZManVector<TPZCompMesh_*,_3> *)in_stack_ffffffffffffff10,
             (int64_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  iVar4 = 0;
  while( true ) {
    lVar2 = (long)iVar4;
    pTVar1 = TPZMultiphysicsCompMesh::MeshVector(in_RSI);
    iVar3 = TPZVec<TPZCompMesh_*>::size(pTVar1);
    if (iVar3 <= lVar2) break;
    pTVar1 = TPZMultiphysicsCompMesh::MeshVector(in_RSI);
    in_stack_ffffffffffffff10 =
         (TPZMultiphysicsCompMesh *)TPZVec<TPZCompMesh_*>::operator[](pTVar1,(long)iVar4);
    in_stack_ffffffffffffff08 = TPZCompMesh::Clone(in_stack_fffffffffffffef0);
    in_stack_ffffffffffffff00 =
         TPZVec<TPZCompMesh_*>::operator[]
                   ((TPZVec<TPZCompMesh_*> *)&stack0xffffffffffffffb0,(long)iVar4);
    *in_stack_ffffffffffffff00 = in_stack_ffffffffffffff08;
    iVar4 = iVar4 + 1;
  }
  InsertPeriferalMaterialObjects
            ((TPZHybridizeHDiv *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_RDI);
  HybridizeInternalSides(in_stack_000000c0,in_stack_000000b8);
  mesh = (TPZCompMesh *)TPZCompMesh::Reference(&in_RSI->super_TPZCompMesh);
  this_00 = (TPZCompMesh *)operator_new(0x9a8);
  TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh
            (in_stack_ffffffffffffff10,(TPZGeoMesh *)in_stack_ffffffffffffff08);
  TPZCompMesh::CopyMaterials(in_stack_ffffffffffffff90,mesh);
  InsertPeriferalMaterialObjects(in_stack_00000220,in_stack_00000218,in_stack_00000210);
  TPZVec<TPZCompMesh_*>::size((TPZVec<TPZCompMesh_*> *)&stack0xffffffffffffffb0);
  TPZManVector<int,_5>::TPZManVector
            ((TPZManVector<int,_5> *)in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
             (int *)in_stack_ffffffffffffff00);
  TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
            (in_stack_ffffffffffffffb0,active_approx_spaces,
             (TPZVec<TPZCompMesh_*> *)CONCAT44(iVar4,in_stack_ffffffffffffffa0));
  TPZManVector<int,_5>::~TPZManVector((TPZManVector<int,_5> *)this_00);
  TPZManVector<TPZCompMesh_*,_3>::~TPZManVector((TPZManVector<TPZCompMesh_*,_3> *)this_00);
  return this_00;
}

Assistant:

TPZCompMesh * TPZHybridizeHDiv::CreateMultiphysicsMesh(TPZMultiphysicsCompMesh *cmesh_HDiv, double Lagrange_term_multiplier /* = 1. */) {
    TPZManVector<TPZCompMesh *, 3> meshvec_Hybrid(cmesh_HDiv->MeshVector().size(), 0);
    for (int i = 0; i < cmesh_HDiv->MeshVector().size(); i++) {
        meshvec_Hybrid[i] = cmesh_HDiv->MeshVector()[i]->Clone();
    }
    InsertPeriferalMaterialObjects(meshvec_Hybrid);
    HybridizeInternalSides(meshvec_Hybrid);

    TPZGeoMesh *gmesh = cmesh_HDiv->Reference();
    TPZMultiphysicsCompMesh *cmesh_Hybrid = new TPZMultiphysicsCompMesh(gmesh);
    cmesh_HDiv->CopyMaterials(*cmesh_Hybrid);
    InsertPeriferalMaterialObjects(cmesh_Hybrid, Lagrange_term_multiplier);

    TPZManVector<int,5> active(meshvec_Hybrid.size(),1);
    cmesh_Hybrid->BuildMultiphysicsSpace(active, meshvec_Hybrid);
    return cmesh_Hybrid;
}